

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

unsigned_long * __thiscall
google::protobuf::RepeatedField<unsigned_long>::Mutable
          (RepeatedField<unsigned_long> *this,int index)

{
  unsigned_long *puVar1;
  int in_ESI;
  RepeatedField<unsigned_long> *in_stack_ffffffffffffffa0;
  
  puVar1 = elements(in_stack_ffffffffffffffa0);
  return puVar1 + in_ESI;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return &elements()[index];
}